

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O0

void __thiscall spdlog::pattern_formatter::~pattern_formatter(pattern_formatter *this)

{
  pattern_formatter *this_local;
  
  std::
  unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
  ::~unordered_map(&this->custom_handlers_);
  std::
  vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
  ::~vector(&this->formatters_);
  std::__cxx11::string::~string((string *)&this->eol_);
  std::__cxx11::string::~string((string *)&this->pattern_);
  formatter::~formatter(&this->super_formatter);
  return;
}

Assistant:

class SPDLOG_API pattern_formatter final : public formatter {
public:
    using custom_flags = std::unordered_map<char, std::unique_ptr<custom_flag_formatter>>;

    explicit pattern_formatter(std::string pattern,
                               pattern_time_type time_type = pattern_time_type::local,
                               std::string eol = spdlog::details::os::default_eol,
                               custom_flags custom_user_flags = custom_flags());

    // use default pattern is not given
    explicit pattern_formatter(pattern_time_type time_type = pattern_time_type::local,
                               std::string eol = spdlog::details::os::default_eol);

    pattern_formatter(const pattern_formatter &other) = delete;
    pattern_formatter &operator=(const pattern_formatter &other) = delete;

    std::unique_ptr<formatter> clone() const override;
    void format(const details::log_msg &msg, memory_buf_t &dest) override;

    template <typename T, typename... Args>
    pattern_formatter &add_flag(char flag, Args &&...args) {
        custom_handlers_[flag] = details::make_unique<T>(std::forward<Args>(args)...);
        return *this;
    }
    void set_pattern(std::string pattern);
    void need_localtime(bool need = true);

private:
    std::string pattern_;
    std::string eol_;
    pattern_time_type pattern_time_type_;
    bool need_localtime_;
    std::tm cached_tm_;
    std::chrono::seconds last_log_secs_;
    std::vector<std::unique_ptr<details::flag_formatter>> formatters_;
    custom_flags custom_handlers_;

    std::tm get_time_(const details::log_msg &msg);
    template <typename Padder>
    void handle_flag_(char flag, details::padding_info padding);

    // Extract given pad spec (e.g. %8X)
    // Advance the given it pass the end of the padding spec found (if any)
    // Return padding.
    static details::padding_info handle_padspec_(std::string::const_iterator &it,
                                                 std::string::const_iterator end);

    void compile_pattern_(const std::string &pattern);
}